

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O2

QStyleOptionViewItem * __thiscall
QItemDelegate::setOptions
          (QStyleOptionViewItem *__return_storage_ptr__,QItemDelegate *this,QModelIndex *index,
          QStyleOptionViewItem *option)

{
  QVariant *pQVar1;
  QBrush *abrush;
  undefined4 uVar2;
  PrivateShared *pPVar3;
  bool bVar4;
  QFlags<Qt::AlignmentFlag> QVar5;
  long in_FS_OFFSET;
  undefined1 auStack_88 [16];
  QVariant local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  memset(__return_storage_ptr__,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem(__return_storage_ptr__,option);
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::data((QVariant *)&local_58,index,6);
  if ((undefined1 *)0x3 < puStack_40) {
    qvariant_cast<QFont>((QVariant *)auStack_88);
    QFont::resolve((QFont *)(auStack_88 + 0x10));
    pPVar3 = *(PrivateShared **)&__return_storage_ptr__->font;
    *(PrivateShared **)&__return_storage_ptr__->font = local_78.d.data.shared;
    uVar2 = *(undefined4 *)&__return_storage_ptr__->field_0x60;
    *(undefined4 *)&__return_storage_ptr__->field_0x60 = local_78.d.data._8_4_;
    local_78.d.data.shared = pPVar3;
    local_78.d.data._8_4_ = uVar2;
    QFont::~QFont((QFont *)(auStack_88 + 0x10));
    QFont::~QFont((QFont *)auStack_88);
    QFontMetrics::QFontMetrics((QFontMetrics *)(auStack_88 + 0x10),&__return_storage_ptr__->font);
    pPVar3 = *(PrivateShared **)&(__return_storage_ptr__->super_QStyleOption).fontMetrics;
    *(PrivateShared **)&(__return_storage_ptr__->super_QStyleOption).fontMetrics =
         local_78.d.data.shared;
    local_78.d.data.shared = pPVar3;
    QFontMetrics::~QFontMetrics((QFontMetrics *)(auStack_88 + 0x10));
  }
  pQVar1 = (QVariant *)(auStack_88 + 0x10);
  QModelIndex::data(pQVar1,index,7);
  ::QVariant::operator=((QVariant *)&local_58,pQVar1);
  ::QVariant::~QVariant(pQVar1);
  if ((undefined1 *)0x3 < puStack_40) {
    QVar5 = QtPrivate::legacyFlagValueFromModelData<QFlags<Qt::AlignmentFlag>>
                      ((QVariant *)&local_58);
    (__return_storage_ptr__->displayAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (Int)QVar5.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
              super_QFlagsStorage<Qt::AlignmentFlag>.i;
  }
  pQVar1 = (QVariant *)(auStack_88 + 0x10);
  QModelIndex::data(pQVar1,index,9);
  ::QVariant::operator=((QVariant *)&local_58,pQVar1);
  ::QVariant::~QVariant(pQVar1);
  bVar4 = ::QVariant::canConvert<QBrush>((QVariant *)&local_58);
  if (bVar4) {
    abrush = (QBrush *)(auStack_88 + 0x10);
    qvariant_cast<QBrush>((QVariant *)abrush);
    QPalette::setBrush(&(__return_storage_ptr__->super_QStyleOption).palette,Text,abrush);
    QBrush::~QBrush(abrush);
  }
  (__return_storage_ptr__->super_QStyleOption).styleObject = (QObject *)0x0;
  ::QVariant::~QVariant((QVariant *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStyleOptionViewItem QItemDelegate::setOptions(const QModelIndex &index,
                                               const QStyleOptionViewItem &option) const
{
    QStyleOptionViewItem opt = option;

    // set font
    QVariant value = index.data(Qt::FontRole);
    if (value.isValid()){
        opt.font = qvariant_cast<QFont>(value).resolve(opt.font);
        opt.fontMetrics = QFontMetrics(opt.font);
    }

    // set text alignment
    value = index.data(Qt::TextAlignmentRole);
    if (value.isValid())
        opt.displayAlignment = QtPrivate::legacyFlagValueFromModelData<Qt::Alignment>(value);

    // set foreground brush
    value = index.data(Qt::ForegroundRole);
    if (value.canConvert<QBrush>())
        opt.palette.setBrush(QPalette::Text, qvariant_cast<QBrush>(value));

    // disable style animations for checkboxes etc. within itemviews (QTBUG-30146)
    opt.styleObject = nullptr;

    return opt;
}